

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O1

bool libwebm::CopyMasteringMetadata(MasteringMetadata *parser_mm,MasteringMetadata *muxer_mm)

{
  float fVar1;
  bool bVar2;
  PrimaryChromaticityPtr wp_ptr;
  PrimaryChromaticityPtr b_ptr;
  PrimaryChromaticityPtr g_ptr;
  PrimaryChromaticityPtr r_ptr;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_30;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_28;
  __uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
  local_20;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_18;
  
  fVar1 = parser_mm->luminance_max;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    muxer_mm->luminance_max_ = fVar1;
  }
  fVar1 = parser_mm->luminance_min;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    muxer_mm->luminance_min_ = fVar1;
  }
  local_18._M_head_impl = (PrimaryChromaticity *)0x0;
  local_20._M_t.
  super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
  .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>._M_head_impl =
       (tuple<mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>)
       (_Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
        )0x0;
  local_28._M_head_impl = (PrimaryChromaticity *)0x0;
  local_30._M_head_impl = (PrimaryChromaticity *)0x0;
  if (parser_mm->r == (PrimaryChromaticity *)0x0) {
LAB_0014a613:
    if (parser_mm->g != (PrimaryChromaticity *)0x0) {
      bVar2 = CopyPrimaryChromaticity(parser_mm->g,(PrimaryChromaticityPtr *)&local_20);
      if (!bVar2) goto LAB_0014a678;
    }
    if (parser_mm->b != (PrimaryChromaticity *)0x0) {
      bVar2 = CopyPrimaryChromaticity(parser_mm->b,(PrimaryChromaticityPtr *)&local_28);
      if (!bVar2) goto LAB_0014a678;
    }
    if (parser_mm->white_point != (PrimaryChromaticity *)0x0) {
      bVar2 = CopyPrimaryChromaticity(parser_mm->white_point,(PrimaryChromaticityPtr *)&local_30);
      if (!bVar2) goto LAB_0014a678;
    }
    bVar2 = mkvmuxer::MasteringMetadata::SetChromaticity
                      (muxer_mm,local_18._M_head_impl,
                       (PrimaryChromaticity *)
                       local_20._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                       .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>._M_head_impl,
                       local_28._M_head_impl,local_30._M_head_impl);
  }
  else {
    bVar2 = CopyPrimaryChromaticity(parser_mm->r,(PrimaryChromaticityPtr *)&local_18);
    if (bVar2) goto LAB_0014a613;
LAB_0014a678:
    bVar2 = false;
  }
  if (local_30._M_head_impl != (PrimaryChromaticity *)0x0) {
    operator_delete(local_30._M_head_impl);
  }
  if (local_28._M_head_impl != (PrimaryChromaticity *)0x0) {
    operator_delete(local_28._M_head_impl);
  }
  if (local_20._M_t.
      super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
      .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
       )0x0) {
    operator_delete((void *)local_20._M_t.
                            super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                            .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>.
                            _M_head_impl);
  }
  if (local_18._M_head_impl != (PrimaryChromaticity *)0x0) {
    operator_delete(local_18._M_head_impl);
  }
  return bVar2;
}

Assistant:

bool CopyMasteringMetadata(const mkvparser::MasteringMetadata& parser_mm,
                           mkvmuxer::MasteringMetadata* muxer_mm) {
  if (MasteringMetadataValuePresent(parser_mm.luminance_max))
    muxer_mm->set_luminance_max(parser_mm.luminance_max);
  if (MasteringMetadataValuePresent(parser_mm.luminance_min))
    muxer_mm->set_luminance_min(parser_mm.luminance_min);

  PrimaryChromaticityPtr r_ptr(nullptr);
  PrimaryChromaticityPtr g_ptr(nullptr);
  PrimaryChromaticityPtr b_ptr(nullptr);
  PrimaryChromaticityPtr wp_ptr(nullptr);

  if (parser_mm.r) {
    if (!CopyPrimaryChromaticity(*parser_mm.r, &r_ptr))
      return false;
  }
  if (parser_mm.g) {
    if (!CopyPrimaryChromaticity(*parser_mm.g, &g_ptr))
      return false;
  }
  if (parser_mm.b) {
    if (!CopyPrimaryChromaticity(*parser_mm.b, &b_ptr))
      return false;
  }
  if (parser_mm.white_point) {
    if (!CopyPrimaryChromaticity(*parser_mm.white_point, &wp_ptr))
      return false;
  }

  if (!muxer_mm->SetChromaticity(r_ptr.get(), g_ptr.get(), b_ptr.get(),
                                 wp_ptr.get())) {
    return false;
  }

  return true;
}